

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O1

void Nf_StoCreateGateAdd(Nf_Man_t *pMan,word uTruth,int *pFans,int nFans,int CellId,
                        Vec_Wec_t *vProfs,Vec_Wrd_t *vStore)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  Vec_Int_t *p;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  Mio_Cell2_t *pCell;
  long lVar9;
  word uFunc;
  Vec_Int_t *local_48;
  ulong local_38;
  
  pCell = pMan->pCells + CellId;
  uVar8 = (uint)uTruth & 1;
  uVar7 = (ulong)uVar8;
  local_38 = -uVar7 ^ uTruth;
  uVar3 = Vec_MemHashInsert(pMan->vTtMem,&local_38);
  if (uVar3 == pMan->vTt2Match->nSize) {
    Vec_WecPushLevel(pMan->vTt2Match);
  }
  if (-1 < (int)uVar3) {
    uVar1 = pMan->vTt2Match->nSize;
    if ((int)uVar3 < (int)uVar1) {
      if (*(uint *)&pCell->field_0x10 >> 0x1c != nFans) {
        __assert_fail("nFans == (int)pCell->nFanins",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                      ,0xc6,
                      "void Nf_StoCreateGateAdd(Nf_Man_t *, word, int *, int, int, Vec_Wec_t *, Vec_Wrd_t *)"
                     );
      }
      p = pMan->vTt2Match->pArray + uVar3;
      if (0 < nFans) {
        uVar5 = 0;
        do {
          uVar8 = pFans[uVar5];
          if ((int)uVar8 < 0) goto LAB_006f1f65;
          bVar2 = (byte)(uVar8 >> 1);
          uVar8 = (uint)uVar7 & 0xffffff01 | ((int)uVar5 << (bVar2 * '\x04' & 0x1f)) << 8 |
                  (((uVar8 & 1) << (bVar2 & 0x1f)) * 2 | (uint)uVar7) & 0xfe;
          uVar7 = (ulong)uVar8;
          uVar5 = uVar5 + 1;
        } while ((uint)nFans != uVar5);
      }
      if (pMan->pPars->fPinFilter == 0) {
        local_48 = (Vec_Int_t *)0x0;
      }
      else {
        if (uVar1 != vProfs->nSize) {
          __assert_fail("Vec_WecSize(pMan->vTt2Match) == Vec_WecSize(vProfs)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                        ,0xd0,
                        "void Nf_StoCreateGateAdd(Nf_Man_t *, word, int *, int, int, Vec_Wec_t *, Vec_Wrd_t *)"
                       );
        }
        if (uVar3 == vProfs->nSize) {
          Vec_WecPushLevel(vProfs);
        }
        if (vProfs->nSize <= (int)uVar3) goto LAB_006f1fc2;
        if (p->nSize != vProfs->pArray[uVar3].nSize * 2) {
          __assert_fail("Vec_IntSize(vArray) == 2 * Vec_IntSize(vArrayProfs)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                        ,0xd4,
                        "void Nf_StoCreateGateAdd(Nf_Man_t *, word, int *, int, int, Vec_Wec_t *, Vec_Wrd_t *)"
                       );
        }
        local_48 = vProfs->pArray + uVar3;
        if (1 < p->nSize) {
          iVar6 = 1;
          lVar9 = 0;
          do {
            if ((char)p->pArray[lVar9 * 2 + 1] == (char)uVar8) {
              if (local_48->nSize <= (int)lVar9) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                              ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              iVar4 = local_48->pArray[lVar9];
              if (((long)iVar4 < 0) || (vStore->nSize <= iVar4)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                              ,0x19d,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
              }
              iVar4 = Nf_StoCellIsDominated(pCell,pFans,vStore->pArray + iVar4);
              if (iVar4 != 0) {
                return;
              }
            }
            lVar9 = lVar9 + 1;
            iVar6 = iVar6 + 2;
          } while (iVar6 < p->nSize);
        }
      }
      if (pMan->pPars->fPinPerm == 0) {
        iVar6 = p->nSize;
        if (pMan->pPars->fPinQuick == 0) {
          if (1 < iVar6) {
            lVar9 = 1;
            do {
              if ((p->pArray[lVar9 + -1] == CellId) && (((p->pArray[lVar9] ^ uVar8) & 0xfe) == 0)) {
                return;
              }
              lVar9 = lVar9 + 2;
            } while ((int)lVar9 < iVar6);
          }
        }
        else if (1 < iVar6) {
          lVar9 = 1;
          do {
            if ((p->pArray[lVar9 + -1] == CellId) &&
               (*(int *)((long)Abc_TtBitCount8 + (ulong)(p->pArray[lVar9] & 0xfe) * 2) ==
                Abc_TtBitCount8[uVar8 >> 1 & 0x7f])) {
              return;
            }
            lVar9 = lVar9 + 2;
          } while ((int)lVar9 < iVar6);
        }
      }
      Vec_IntPush(p,CellId);
      Vec_IntPush(p,uVar8);
      if (pMan->pPars->fPinFilter != 0) {
        Vec_IntPush(local_48,vStore->nSize);
        Vec_WrdPush(vStore,pCell->Area);
        if (0 < nFans) {
          uVar7 = 0;
          do {
            if (pFans[uVar7] < 0) {
LAB_006f1f65:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                            ,0x10c,"int Abc_Lit2Var(int)");
            }
            Vec_WrdPush(vStore,pCell->Delays[(uint)pFans[uVar7] >> 1]);
            uVar7 = uVar7 + 1;
          } while ((uint)nFans != uVar7);
        }
      }
      return;
    }
  }
LAB_006f1fc2:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWec.h"
                ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
}

Assistant:

void Nf_StoCreateGateAdd( Nf_Man_t * pMan, word uTruth, int * pFans, int nFans, int CellId, Vec_Wec_t * vProfs, Vec_Wrd_t * vStore )
{
    Vec_Int_t * vArray, * vArrayProfs = NULL;
    Mio_Cell2_t * pCell = Nf_ManCell( pMan, CellId );
    int i, k, GateId, Entry, fCompl = (int)(uTruth & 1);
    word uFunc = fCompl ? ~uTruth : uTruth;
    int iFunc = Vec_MemHashInsert( pMan->vTtMem, &uFunc );
    Nf_Cfg_t Mat = Nf_Int2Cfg(0);
    // get match array
    if ( iFunc == Vec_WecSize(pMan->vTt2Match) )
        Vec_WecPushLevel( pMan->vTt2Match );
    vArray = Vec_WecEntry( pMan->vTt2Match, iFunc );
    // create match
    Mat.fCompl = fCompl;
    assert( nFans == (int)pCell->nFanins );
    for ( i = 0; i < nFans; i++ )
    {
        Mat.Perm  |= (unsigned)(i << (Abc_Lit2Var(pFans[i]) << 2));
        Mat.Phase |= (unsigned)(Abc_LitIsCompl(pFans[i]) << Abc_Lit2Var(pFans[i]));
    }
    // check other profiles
    if ( pMan->pPars->fPinFilter )
    {
        // get profile array
        assert( Vec_WecSize(pMan->vTt2Match) == Vec_WecSize(vProfs) );
        if ( iFunc == Vec_WecSize(vProfs) )
            Vec_WecPushLevel( vProfs );
        vArrayProfs = Vec_WecEntry( vProfs, iFunc );
        assert( Vec_IntSize(vArray) == 2 * Vec_IntSize(vArrayProfs) );
        // skip dominated matches
        Vec_IntForEachEntryDouble( vArray, GateId, Entry, i )
            if ( Nf_Int2Cfg(Entry).Phase == Mat.Phase && Nf_Int2Cfg(Entry).fCompl == Mat.fCompl )
            {
                int Offset = Vec_IntEntry(vArrayProfs, i/2);
                word * pProf = Vec_WrdEntryP(vStore, Offset);
                if ( Nf_StoCellIsDominated(pCell, pFans, pProf) )
                    return;
            }
    }
    // check pin permutation
    if ( !pMan->pPars->fPinPerm ) // do not use  pin-permutation (improves delay when pin-delays differ)
    {
        if ( pMan->pPars->fPinQuick ) // reduce the number of matches agressively
        {
            Vec_IntForEachEntryDouble( vArray, GateId, Entry, i )
                if ( GateId == CellId && Abc_TtBitCount8[Nf_Int2Cfg(Entry).Phase] == Abc_TtBitCount8[Mat.Phase] )
                    return;
        }
        else // reduce the number of matches less agressively
        {
            Vec_IntForEachEntryDouble( vArray, GateId, Entry, i )
                if ( GateId == CellId && Nf_Int2Cfg(Entry).Phase == Mat.Phase )
                    return;
        }
    }
    // save data and profile
    Vec_IntPush( vArray, CellId );
    Vec_IntPush( vArray, Nf_Cfg2Int(Mat) );
    // add delay profile
    if ( pMan->pPars->fPinFilter )
    {
        Vec_IntPush( vArrayProfs, Vec_WrdSize(vStore) );
        Vec_WrdPush( vStore, pCell->Area );
        for ( k = 0; k < nFans; k++ )
            Vec_WrdPush( vStore, pCell->Delays[Abc_Lit2Var(pFans[k])] );
    }
}